

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Type __thiscall wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Type type)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  Type *pTVar5;
  uintptr_t *puVar6;
  HeapType HVar7;
  Nullability NVar8;
  Type local_80;
  Type local_78;
  undefined1 local_70 [8];
  Iterator __begin2;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  Type local_38;
  Type type_local;
  
  local_38.id = type.id;
  cVar1 = wasm::Type::isTuple();
  if (cVar1 == '\0') {
    cVar1 = wasm::Type::isRef();
    if (cVar1 == '\0') {
      local_80.id = local_38.id;
      if (6 < local_38.id) {
        __assert_fail("type.isBasic()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0xdbf,"Type wasm::TranslateToFuzzReader::getSubType(Type)");
      }
    }
    else {
      HVar7.id = wasm::Type::getHeapType();
      HVar7 = getSubType(this,HVar7);
      iVar3 = wasm::Type::getNullability();
      NVar8 = NonNullable;
      if ((iVar3 != 0) &&
         ((((byte)this->wasm[0x109] & 4) == 0 ||
          (uVar4 = Random::upTo(&this->random,2), NVar8 = NonNullable, uVar4 != 0)))) {
        NVar8 = Nullable;
      }
      wasm::Type::Type((Type *)auStack_58,HVar7,NVar8);
      bVar2 = isUninhabitable((Type)auStack_58);
      if (((!bVar2) || (bVar2 = isUninhabitable(local_38), bVar2)) ||
         (uVar4 = Random::upTo(&this->random,0x14), pTVar5 = &local_38, uVar4 == 0)) {
        pTVar5 = (Type *)auStack_58;
      }
      local_80.id = pTVar5->id;
    }
  }
  else {
    auStack_58 = (undefined1  [8])0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_70 = (undefined1  [8])&local_38;
    pTVar5 = (Type *)wasm::Type::size();
    if (pTVar5 != (Type *)0x0) {
      do {
        puVar6 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_70);
        local_78 = getSubType(this,*puVar6);
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,
                     (iterator)
                     types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_78);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)local_78;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                != pTVar5) || (local_70 != (undefined1  [8])&local_38));
    }
    Tuple::Tuple((Tuple *)local_70,(TypeList *)auStack_58);
    wasm::Type::Type(&local_80,(Tuple *)local_70);
    if (local_70 != (undefined1  [8])0x0) {
      operator_delete((void *)local_70,
                      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index - (long)local_70);
    }
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  return (Type)local_80.id;
}

Assistant:

Type TranslateToFuzzReader::getSubType(Type type) {
  if (type.isTuple()) {
    std::vector<Type> types;
    for (const auto& t : type) {
      types.push_back(getSubType(t));
    }
    return Type(types);
  } else if (type.isRef()) {
    auto heapType = getSubType(type.getHeapType());
    auto nullability = getSubType(type.getNullability());
    auto subType = Type(heapType, nullability);
    // We don't want to emit lots of uninhabitable types like (ref none), so
    // avoid them with high probability. Specifically, if the original type was
    // inhabitable then return that; avoid adding more uninhabitability.
    if (isUninhabitable(subType) && !isUninhabitable(type) && !oneIn(20)) {
      return type;
    }
    return subType;
  } else {
    // This is an MVP type without subtypes.
    assert(type.isBasic());
    return type;
  }
}